

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::forStruct
          (Compilation *comp,ReplicatedAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  Type *lhs;
  Expression *rhs;
  undefined8 uVar1;
  Scope *args;
  Type *context_00;
  ReplicatedAssignmentPatternSyntax *this;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ExpressionSyntax *syntax_00;
  size_type sVar6;
  size_t sVar7;
  Diagnostic *pDVar8;
  ASTContext *this_00;
  reference ppTVar9;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  const_iterator cVar10;
  Token TVar11;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_1c8;
  Compilation *local_1b8;
  ReplicatedAssignmentPatternExpression *result;
  bitmask<slang::ast::ASTFlags> local_1a8;
  Token local_1a0;
  SourceLocation local_190;
  ReplicatedAssignmentPatternExpression *local_188;
  Expression *expr;
  ExpressionSyntax *item;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range3;
  size_t i;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  size_t index;
  bool bad;
  Diagnostic *diag;
  FieldSymbol *local_c8;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end2;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin2;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> local_a0;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> *local_90;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> *__range2;
  SmallVector<const_slang::ast::Type_*,_5UL> types;
  Expression *countExpr;
  size_t count;
  Scope *structScope_local;
  Type *type_local;
  ASTContext *context_local;
  ReplicatedAssignmentPatternSyntax *syntax_local;
  Compilation *comp_local;
  
  countExpr = (Expression *)0x0;
  count = (size_t)structScope;
  structScope_local = (Scope *)type;
  type_local = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (ReplicatedAssignmentPatternSyntax *)comp;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->countExpr);
  types.stackBase._24_8_ =
       bindReplCount(comp,syntax_00,(ASTContext *)type_local,(size_t *)&countExpr);
  bVar2 = Expression::bad((Expression *)types.stackBase._24_8_);
  if (bVar2) {
    comp_local = (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
  }
  else {
    SmallVector<const_slang::ast::Type_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Type_*,_5UL> *)&__range2);
    local_a0 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)count);
    local_90 = &local_a0;
    __end2 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>::
             begin(local_90);
    field = (FieldSymbol *)
            iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>::
            end(local_90);
    while( true ) {
      bVar2 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_std::forward_iterator_tag,_const_slang::ast::FieldSymbol,_long,_const_slang::ast::FieldSymbol_*,_const_slang::ast::FieldSymbol_&>
              ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_std::forward_iterator_tag,_const_slang::ast::FieldSymbol,_long,_const_slang::ast::FieldSymbol_*,_const_slang::ast::FieldSymbol_&>
                            *)&__end2,(specific_symbol_iterator<slang::ast::FieldSymbol> *)&field);
      if (!bVar2) break;
      local_c8 = Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator*(&__end2);
      diag = (Diagnostic *)ValueSymbol::getType((ValueSymbol *)local_c8);
      SmallVectorBase<const_slang::ast::Type_*>::push_back
                ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2,(Type **)&diag);
      Scope::specific_symbol_iterator<slang::ast::FieldSymbol>::operator++(&__end2);
    }
    sVar6 = SmallVectorBase<const_slang::ast::Type_*>::size
                      ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2);
    sVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(context_local + 1));
    if (sVar6 == sVar7 * (long)countExpr) {
      bVar2 = false;
      bVar4 = false;
      elems.stackBase[0x18] = '\0';
      elems.stackBase[0x19] = '\0';
      elems.stackBase[0x1a] = '\0';
      elems.stackBase[0x1b] = '\0';
      elems.stackBase[0x1c] = '\0';
      elems.stackBase[0x1d] = '\0';
      elems.stackBase[0x1e] = '\0';
      elems.stackBase[0x1f] = '\0';
      SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&i);
      src = extraout_RDX;
      for (__range3 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x0;
          this = syntax_local, args = structScope_local, uVar1 = types.stackBase._24_8_,
          __range3 < countExpr;
          __range3 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                     ((long)&(__range3->super_SyntaxListBase)._vptr_SyntaxListBase + 1)) {
        this_00 = context_local + 1;
        cVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                           ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)this_00);
        __end3.index = (size_t)cVar10.list;
        cVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                           ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)this_00);
        while( true ) {
          __end3.list = (ParentList *)cVar10.index;
          item = (ExpressionSyntax *)cVar10.list;
          bVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
                  ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
                                *)&__end3.index,
                               (iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&item);
          if (!bVar3) break;
          expr = (Expression *)
                 slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                 iterator_base<const_slang::syntax::ExpressionSyntax_*>::operator*
                           ((iterator_base<const_slang::syntax::ExpressionSyntax_*> *)&__end3.index)
          ;
          uVar1 = elems.stackBase._24_8_;
          elems.stackBase._24_8_ = elems.stackBase._24_8_ + 1;
          ppTVar9 = SmallVectorBase<const_slang::ast::Type_*>::operator[]
                              ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2,uVar1);
          rhs = expr;
          lhs = *ppTVar9;
          TVar11 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)expr);
          local_1a0 = TVar11;
          local_190 = parsing::Token::location(&local_1a0);
          context_00 = type_local;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_1a8,None);
          result = (ReplicatedAssignmentPatternExpression *)
                   Expression::bindRValue
                             (lhs,(ExpressionSyntax *)rhs,local_190,(ASTContext *)context_00,
                              local_1a8);
          local_188 = result;
          SmallVectorBase<const_slang::ast::Expression_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)&i,(Expression **)&result);
          bVar4 = Expression::bad((Expression *)local_188);
          bVar2 = bVar2 || bVar4;
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::ExpressionSyntax_*,_unsigned_long,_const_slang::syntax::ExpressionSyntax_**,_const_slang::syntax::ExpressionSyntax_*&>
                        *)&__end3.index);
          cVar10.index = (size_t)__end3.list;
          cVar10.list = (ParentList *)item;
          bVar4 = bVar2;
        }
        src = extraout_RDX_00;
      }
      iVar5 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        ((SmallVectorBase<const_slang::ast::Expression_*> *)&i,
                         (EVP_PKEY_CTX *)syntax_local,src);
      local_1c8.data_ = (pointer)CONCAT44(extraout_var,iVar5);
      local_1b8 = (Compilation *)
                  BumpAllocator::
                  emplace<slang::ast::ReplicatedAssignmentPatternExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                            ((BumpAllocator *)this,(Type *)args,(Expression *)uVar1,&local_1c8,
                             &sourceRange);
      comp_local = local_1b8;
      if (bVar4) {
        comp_local = (Compilation *)
                     Expression::badExpr((Compilation *)syntax_local,(Expression *)local_1b8);
      }
      SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&i);
    }
    else {
      pDVar8 = ASTContext::addDiag((ASTContext *)type_local,(DiagCode)0x970007,sourceRange);
      pDVar8 = ast::operator<<(pDVar8,(Type *)structScope_local);
      sVar6 = SmallVectorBase<const_slang::ast::Type_*>::size
                        ((SmallVectorBase<const_slang::ast::Type_*> *)&__range2);
      pDVar8 = Diagnostic::operator<<(pDVar8,sVar6);
      sVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(context_local + 1)
                        );
      Diagnostic::operator<<(pDVar8,sVar7 * (long)countExpr);
      comp_local = (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0)
      ;
    }
    SmallVector<const_slang::ast::Type_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Type_*,_5UL> *)&__range2);
  }
  return (Expression *)comp_local;
}

Assistant:

Expression& ReplicatedAssignmentPatternExpression::forStruct(
    Compilation& comp, const ReplicatedAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    size_t count = 0;
    auto& countExpr = bindReplCount(comp, *syntax.countExpr, context, count);
    if (countExpr.bad())
        return badExpr(comp, nullptr);

    SmallVector<const Type*> types;
    for (auto& field : structScope.membersOfType<FieldSymbol>())
        types.push_back(&field.getType());

    if (types.size() != syntax.items.size() * count) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << type << types.size() << syntax.items.size() * count;
        return badExpr(comp, nullptr);
    }

    bool bad = false;
    size_t index = 0;
    SmallVector<const Expression*> elems;
    for (size_t i = 0; i < count; i++) {
        for (auto item : syntax.items) {
            auto& expr = Expression::bindRValue(*types[index++], *item,
                                                item->getFirstToken().location(), context);
            elems.push_back(&expr);
            bad |= expr.bad();
        }
    }

    auto result = comp.emplace<ReplicatedAssignmentPatternExpression>(type, countExpr,
                                                                      elems.copy(comp),
                                                                      sourceRange);
    if (bad)
        return badExpr(comp, result);

    return *result;
}